

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_seti(lua_State *L,int idx,lua_Integer n)

{
  TValue *key;
  int iVar1;
  undefined4 uVar2;
  TValue *t;
  TValue *slot;
  StkId pTVar3;
  long lVar4;
  
  t = index2addr(L,idx);
  if (t->tt_ == 0x45) {
    slot = luaH_getint((Table *)(t->value_).gc,n);
    if (slot->tt_ != 0) {
      pTVar3 = L->top;
      if ((((pTVar3[-1].tt_ & 0x40) != 0) && ((((Table *)(t->value_).gc)->marked & 4) != 0)) &&
         (((pTVar3[-1].value_.gc)->marked & 3) != 0)) {
        luaC_barrierback_(L,(Table *)(t->value_).gc);
        pTVar3 = L->top;
      }
      iVar1 = pTVar3[-1].tt_;
      uVar2 = *(undefined4 *)&pTVar3[-1].field_0xc;
      slot->value_ = pTVar3[-1].value_;
      slot->tt_ = iVar1;
      *(undefined4 *)&slot->field_0xc = uVar2;
      lVar4 = -0x10;
      goto LAB_00105542;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  pTVar3 = L->top;
  (pTVar3->value_).i = n;
  pTVar3->tt_ = 0x13;
  key = L->top;
  L->top = key + 1;
  luaV_finishset(L,t,key,key + -1,slot);
  lVar4 = -0x20;
LAB_00105542:
  L->top = (StkId)((long)&L->top->value_ + lVar4);
  return;
}

Assistant:

LUA_API void lua_seti (lua_State *L, int idx, lua_Integer n) {
  StkId t;
  const TValue *slot;
  lua_lock(L);
  api_checknelems(L, 1);
  t = index2addr(L, idx);
  if (luaV_fastset(L, t, n, slot, luaH_getint, L->top - 1))
    L->top--;  /* pop value */
  else {
    setivalue(L->top, n);
    api_incr_top(L);
    luaV_finishset(L, t, L->top - 1, L->top - 2, slot);
    L->top -= 2;  /* pop value and key */
  }
  lua_unlock(L);
}